

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

ssize_t __thiscall r_code::SysView::write(SysView *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  Atom *pAVar2;
  uint *puVar3;
  undefined4 in_register_00000034;
  undefined4 *puVar4;
  ulong local_28;
  size_t j;
  size_t i;
  uint32_t *data_local;
  SysView *this_local;
  
  puVar4 = (undefined4 *)CONCAT44(in_register_00000034,__fd);
  sVar1 = vector<r_code::Atom>::size(&(this->super_ImageObject).code);
  *puVar4 = (int)sVar1;
  sVar1 = vector<unsigned_int>::size(&(this->super_ImageObject).references);
  puVar4[1] = (int)sVar1;
  j = 0;
  while( true ) {
    sVar1 = vector<r_code::Atom>::size(&(this->super_ImageObject).code);
    if (sVar1 <= j) break;
    pAVar2 = vector<r_code::Atom>::operator[](&(this->super_ImageObject).code,j);
    puVar4[j + 2] = pAVar2->atom;
    j = j + 1;
  }
  local_28 = 0;
  while( true ) {
    sVar1 = vector<unsigned_int>::size(&(this->super_ImageObject).references);
    if (sVar1 <= local_28) break;
    puVar3 = vector<unsigned_int>::operator[](&(this->super_ImageObject).references,local_28);
    puVar4[j + 2 + local_28] = *puVar3;
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

void SysView::write(uint32_t *data)
{
    data[0] = code.size();
    data[1] = references.size();
    size_t i = 0;

    for (; i < code.size(); ++i) {
        data[2 + i] = code[i].atom;
    }

    for (size_t j = 0; j < references.size(); ++j) {
        data[2 + i + j] = references[j];
    }
}